

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

channel_s * fio_filter_dup_lock(uint32_t filter)

{
  channel_s *pcVar1;
  undefined1 local_50 [8];
  channel_s ch;
  uint32_t filter_local;
  
  local_50 = (undefined1  [8])0x4;
  ch.name_len = (size_t)&ch.field_0x3c;
  ch.name = (char *)0x8;
  ch._60_4_ = filter;
  memset(&ch.ref,0,0x10);
  ch.subscriptions.next = (fio_ls_embd_s *)&fio_postoffice;
  ch.parent = (fio_collection_s *)0x0;
  ch.match._0_1_ = 0;
  pcVar1 = fio_filter_dup_lock_internal
                     ((channel_s *)local_50,(ulong)(uint)ch._60_4_,&fio_postoffice.filters);
  return pcVar1;
}

Assistant:

static channel_s *fio_filter_dup_lock(uint32_t filter) {
  channel_s ch = (channel_s){
      .name = (char *)&filter,
      .name_len = (sizeof(filter)),
      .parent = &fio_postoffice.filters,
      .ref = 8, /* avoid freeing stack memory */
  };
  return fio_filter_dup_lock_internal(&ch, filter, &fio_postoffice.filters);
}